

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Free(Extension *this)

{
  byte bVar1;
  LogMessage *pLVar2;
  RepeatedField<int> *this_00;
  LogFinisher local_59;
  LogMessage local_58;
  
  bVar1 = this->type;
  if (this->is_repeated == true) {
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar2 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_59,pLVar2);
      LogMessage::~LogMessage(&local_58);
    }
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
    case 1:
    case 8:
      this_00 = (this->field_0).repeated_int32_t_value;
      if (this_00 == (RepeatedField<int> *)0x0) {
        return;
      }
      RepeatedField<int>::~RepeatedField(this_00);
      break;
    case 2:
      this_00 = (RepeatedField<int> *)(this->field_0).repeated_int64_t_value;
      if (this_00 == (RepeatedField<int> *)0x0) {
        return;
      }
      RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_00);
      break;
    case 3:
      this_00 = (RepeatedField<int> *)(this->field_0).repeated_uint32_t_value;
      if (this_00 == (RepeatedField<int> *)0x0) {
        return;
      }
      RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_00);
      break;
    case 4:
      this_00 = (RepeatedField<int> *)(this->field_0).repeated_uint64_t_value;
      if (this_00 == (RepeatedField<int> *)0x0) {
        return;
      }
      RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_00);
      break;
    case 5:
      this_00 = (RepeatedField<int> *)(this->field_0).repeated_double_value;
      if (this_00 == (RepeatedField<int> *)0x0) {
        return;
      }
      RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_00);
      break;
    case 6:
      this_00 = (RepeatedField<int> *)(this->field_0).repeated_float_value;
      if (this_00 == (RepeatedField<int> *)0x0) {
        return;
      }
      RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_00);
      break;
    case 7:
      this_00 = (RepeatedField<int> *)(this->field_0).repeated_bool_value;
      if (this_00 == (RepeatedField<int> *)0x0) {
        return;
      }
      RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_00);
      break;
    case 9:
      this_00 = (RepeatedField<int> *)(this->field_0).repeated_string_value;
      if (this_00 == (RepeatedField<int> *)0x0) {
        return;
      }
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this_00);
      break;
    case 10:
      this_00 = (RepeatedField<int> *)(this->field_0).repeated_message_value;
      if (this_00 == (RepeatedField<int> *)0x0) {
        return;
      }
      RepeatedPtrField<google::protobuf::MessageLite>::~RepeatedPtrField
                ((RepeatedPtrField<google::protobuf::MessageLite> *)this_00);
      break;
    default:
      goto switchD_003d9582_default;
    }
  }
  else {
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar2 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_59,pLVar2);
      LogMessage::~LogMessage(&local_58);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
      if ((this->field_0).message_value == (MessageLite *)0x0) {
        return;
      }
      (*((this->field_0).message_value)->_vptr_MessageLite[1])();
      return;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      return;
    }
    this_00 = (RepeatedField<int> *)(this->field_0).message_value;
    if (this_00 == (RepeatedField<int> *)0x0) {
      return;
    }
    if (*(RepeatedField<int> **)this_00 != this_00 + 1) {
      operator_delete(*(RepeatedField<int> **)this_00);
    }
  }
  operator_delete(this_00);
switchD_003d9582_default:
  return;
}

Assistant:

void ExtensionSet::Extension::Free() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    delete repeated_##LOWERCASE##_value;    \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    switch (cpp_type(type)) {
      case WireFormatLite::CPPTYPE_STRING:
        delete string_value;
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_lazy) {
          delete lazymessage_value;
        } else {
          delete message_value;
        }
        break;
      default:
        break;
    }
  }
}